

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

QList<QByteArray> * __thiscall QTzTimeZonePrivate::availableTimeZoneIds(QTzTimeZonePrivate *this)

{
  iterator __last;
  iterator __first;
  QList<QByteArray> *in_RDI;
  QList<QByteArray> *result;
  QHash<QByteArray,_QTzTimeZone> *in_stack_ffffffffffffffd8;
  
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>::operator->
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_> *)
             0x74fc68);
  QHash<QByteArray,_QTzTimeZone>::keys(in_stack_ffffffffffffffd8);
  __last = QList<QByteArray>::begin(in_RDI);
  __first = QList<QByteArray>::end(in_RDI);
  std::sort<QList<QByteArray>::iterator>(__first,__last);
  return in_RDI;
}

Assistant:

QList<QByteArray> QTzTimeZonePrivate::availableTimeZoneIds() const
{
    QList<QByteArray> result = tzZones->keys();
    std::sort(result.begin(), result.end());
    return result;
}